

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

void Cbs_ManCancelUntil(Cbs_Man_t *p,int iBound)

{
  Gia_Obj_t *pGVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = (p->pProp).iTail;
  if (iVar3 < iBound) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                  ,0x1d7,"void Cbs_ManCancelUntil(Cbs_Man_t *, int)");
  }
  (p->pProp).iHead = iBound;
  for (lVar2 = (long)iBound;
      (lVar2 < iVar3 && (pGVar1 = (p->pProp).pData[lVar2], pGVar1 != (Gia_Obj_t *)0x0));
      lVar2 = lVar2 + 1) {
    if (((uint)*(ulong *)pGVar1 >> 0x1e & 1) == 0) {
      __assert_fail("pVar->fMark0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                    ,0x5c,"void Cbs_VarUnassign(Gia_Obj_t *)");
    }
    *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xbfffffffbfffffff;
    pGVar1->Value = 0xffffffff;
    iVar3 = (p->pProp).iTail;
  }
  (p->pProp).iTail = iBound;
  iVar3 = p->vLevReas->nSize;
  if (SBORROW4(iVar3,iBound * 3) == iVar3 + iBound * -3 < 0) {
    p->vLevReas->nSize = iBound * 3;
    return;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

static inline void Cbs_ManCancelUntil( Cbs_Man_t * p, int iBound )
{
    Gia_Obj_t * pVar;
    int i;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Cbs_QueForEachEntry( p->pProp, pVar, i )
        Cbs_VarUnassign( pVar );
    p->pProp.iTail = iBound;
    Vec_IntShrink( p->vLevReas, 3*iBound );
}